

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

void __thiscall UKF::UpdateLidar(UKF *this,MeasurementPackage *meas_package)

{
  Scalar SVar1;
  VectorXd *this_00;
  int n_z;
  VectorXd z_pred;
  MatrixXd S;
  MatrixXd Zsig;
  Rhs local_c0;
  Lhs local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_a0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_88;
  Product<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_70;
  Product<Eigen::Product<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
  local_50;
  
  n_z = (int)(meas_package->raw_measurements_).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&z_pred,&n_z);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>((Matrix<double,_1,_1,0,_1,_1> *)&S,&n_z,&n_z)
  ;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Zsig,&n_z,&this->n_sigma_);
  PredictLidarMeasurement(this,&this->Xsig_pred_,&Zsig,&z_pred,&S);
  this_00 = &meas_package->raw_measurements_;
  UpdateState(this,this_00,&z_pred,&S,&this->Xsig_pred_,&Zsig,&this->x_,&this->P_);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_88,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z_pred);
  local_b8.m_matrix.m_lhs = local_88.m_lhs;
  local_b8.m_matrix.m_rhs = local_88.m_rhs;
  local_c0.m_xpr =
       (XprTypeNested)
       Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                 ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&S);
  Eigen::
  Product<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
  ::Product(&local_70,&local_b8,&local_c0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_a0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z_pred);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_0>
  ::Product(&local_50,&local_70,&local_a0);
  SVar1 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_50);
  this->NIS_lidar_ = SVar1;
  free(Zsig.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(S.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(z_pred.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void UKF::UpdateLidar(MeasurementPackage meas_package) {
  int n_z = meas_package.raw_measurements_.rows();

  VectorXd z_pred(n_z);
  MatrixXd S(n_z, n_z);
  MatrixXd Zsig(n_z, n_sigma_);

  PredictLidarMeasurement(Xsig_pred_, Zsig, z_pred, S);
  UpdateState(meas_package.raw_measurements_, z_pred, S, Xsig_pred_, Zsig, x_, P_);

  NIS_lidar_ = ((meas_package.raw_measurements_-z_pred).transpose())*S.inverse()*(meas_package.raw_measurements_-z_pred);
}